

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImVec2 CalcWindowSizeAfterConstraint(ImGuiWindow *window,ImVec2 *size_desired)

{
  ImGuiSizeCallback p_Var1;
  uint uVar2;
  uint uVar3;
  float fVar4;
  float fVar6;
  ImVec2 IVar5;
  float fVar7;
  float fVar8;
  float fVar9;
  ImVec2 local_48;
  ImGuiSizeCallbackData local_30;
  
  local_48 = *size_desired;
  if (((GImGui->NextWindowData).Flags & 0x10) != 0) {
    fVar4 = (GImGui->NextWindowData).SizeConstraintRect.Min.x;
    fVar6 = (GImGui->NextWindowData).SizeConstraintRect.Min.y;
    fVar7 = local_48.x;
    fVar9 = local_48.y;
    if ((fVar4 < 0.0) || (fVar8 = (GImGui->NextWindowData).SizeConstraintRect.Max.x, fVar8 < 0.0)) {
      fVar4 = (window->SizeFull).x;
    }
    else {
      if (fVar7 <= fVar8) {
        fVar8 = fVar7;
      }
      fVar4 = (float)(-(uint)(fVar7 < fVar4) & (uint)fVar4 | ~-(uint)(fVar7 < fVar4) & (uint)fVar8);
    }
    if ((fVar6 < 0.0) || (fVar7 = (GImGui->NextWindowData).SizeConstraintRect.Max.y, fVar7 < 0.0)) {
      fVar6 = (window->SizeFull).y;
    }
    else {
      if (fVar9 <= fVar7) {
        fVar7 = fVar9;
      }
      fVar6 = (float)(-(uint)(fVar9 < fVar6) & (uint)fVar6 | ~-(uint)(fVar9 < fVar6) & (uint)fVar7);
    }
    p_Var1 = (GImGui->NextWindowData).SizeCallback;
    if (p_Var1 != (ImGuiSizeCallback)0x0) {
      local_30.UserData = (GImGui->NextWindowData).SizeCallbackUserData;
      local_30.Pos = window->Pos;
      local_30.CurrentSize = window->SizeFull;
      local_30.DesiredSize.x = fVar4;
      local_30.DesiredSize.y = fVar6;
      (*p_Var1)(&local_30);
      fVar4 = local_30.DesiredSize.x;
      fVar6 = local_30.DesiredSize.y;
    }
    local_48.y = (float)(int)fVar6;
    local_48.x = (float)(int)fVar4;
  }
  IVar5 = CalcWindowMinSize(window);
  uVar2 = -(uint)(IVar5.x <= local_48.x);
  uVar3 = -(uint)(IVar5.y <= local_48.y);
  return (ImVec2)(CONCAT44(~uVar3 & (uint)IVar5.y,~uVar2 & (uint)IVar5.x) |
                 CONCAT44((uint)local_48.y & uVar3,(uint)local_48.x & uVar2));
}

Assistant:

static ImVec2 CalcWindowSizeAfterConstraint(ImGuiWindow* window, const ImVec2& size_desired)
{
    ImGuiContext& g = *GImGui;
    ImVec2 new_size = size_desired;
    if (g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasSizeConstraint)
    {
        // See comments in SetNextWindowSizeConstraints() for details about setting size_min an size_max.
        ImRect cr = g.NextWindowData.SizeConstraintRect;
        new_size.x = (cr.Min.x >= 0 && cr.Max.x >= 0) ? ImClamp(new_size.x, cr.Min.x, cr.Max.x) : window->SizeFull.x;
        new_size.y = (cr.Min.y >= 0 && cr.Max.y >= 0) ? ImClamp(new_size.y, cr.Min.y, cr.Max.y) : window->SizeFull.y;
        if (g.NextWindowData.SizeCallback)
        {
            ImGuiSizeCallbackData data;
            data.UserData = g.NextWindowData.SizeCallbackUserData;
            data.Pos = window->Pos;
            data.CurrentSize = window->SizeFull;
            data.DesiredSize = new_size;
            g.NextWindowData.SizeCallback(&data);
            new_size = data.DesiredSize;
        }
        new_size.x = IM_TRUNC(new_size.x);
        new_size.y = IM_TRUNC(new_size.y);
    }

    // Minimum size
    ImVec2 size_min = CalcWindowMinSize(window);
    return ImMax(new_size, size_min);
}